

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multithread.cpp
# Opt level: O0

void indk::ComputeBackendMultithread::tWorker(void *object)

{
  Neuron *this;
  long tT;
  pair<float,_float> S_00;
  pointer plVar1;
  bool bVar2;
  int iVar3;
  uint _Xm;
  uint _DimensionsCount;
  Position *this_00;
  Position *this_01;
  Position *this_02;
  size_type sVar4;
  reference ppvVar5;
  reference pvVar6;
  int64_t iVar7;
  int64_t iVar8;
  Entry *this_03;
  Receptor *this_04;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float Gamma;
  float dGamma;
  pair<float,_float> local_118;
  Synapse *local_110;
  Synapse *S;
  Entry *pEStack_100;
  uint k;
  Entry *E_1;
  float local_f0;
  int j_1;
  pair<float,_float> FiValues;
  Position *SPos;
  Receptor *R;
  int i;
  Entry *E;
  Position *pPStack_c0;
  int j;
  Position *RPos;
  uint DimensionsCount;
  uint Xm;
  float P;
  float D;
  float FiSum;
  int64_t ComputeSize;
  value_type t;
  Neuron *N;
  ulong local_80;
  uint64_t n;
  uint64_t size;
  undefined1 local_68 [4];
  int tdone;
  vector<long,_std::allocator<long>_> times;
  Position *nRPos;
  Position *dRPos;
  Position *zPos;
  unique_lock<std::mutex> lk;
  Worker *worker;
  void *object_local;
  
  lk._8_8_ = object;
  do {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)&zPos,(mutex_type *)(lk._8_8_ + 0x30));
    std::condition_variable::wait((unique_lock *)(lk._8_8_ + 0x58));
    this_00 = (Position *)operator_new(0x10);
    Position::Position(this_00,0,3);
    this_01 = (Position *)operator_new(0x10);
    Position::Position(this_01,0,3);
    this_02 = (Position *)operator_new(0x10);
    Position::Position(this_02,0,3);
    times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)this_02;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_68);
    size._4_4_ = 0;
    n = std::vector<void_*,_std::allocator<void_*>_>::size
                  ((vector<void_*,_std::allocator<void_*>_> *)lk._8_8_);
    while ((ulong)(long)size._4_4_ < n) {
      for (local_80 = 0; uVar10 = local_80, local_80 < n; local_80 = local_80 + 1) {
        sVar4 = std::vector<long,_std::allocator<long>_>::size
                          ((vector<long,_std::allocator<long>_> *)local_68);
        if (sVar4 <= uVar10) {
          N = (Neuron *)0x0;
          std::vector<long,_std::allocator<long>_>::push_back
                    ((vector<long,_std::allocator<long>_> *)local_68,(value_type_conflict3 *)&N);
        }
        ppvVar5 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                            ((vector<void_*,_std::allocator<void_*>_> *)lk._8_8_,local_80);
        this = (Neuron *)*ppvVar5;
        pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)local_68,local_80);
        tT = *pvVar6;
        iVar7 = Neuron::getSignalBufferSize(this);
        if ((tT < iVar7) && (iVar3 = Neuron::getState(this,tT), iVar3 == 1)) {
          DimensionsCount = 0;
          _Xm = Neuron::getXm(this);
          _DimensionsCount = Neuron::getDimensionsCount(this);
          Position::setXm(this_00,_Xm);
          Position::setDimensionsCount(this_00,_DimensionsCount);
          Position::setXm(this_01,_Xm);
          Position::setDimensionsCount(this_01,_DimensionsCount);
          Position::setXm((Position *)
                          times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,_Xm);
          Position::setDimensionsCount
                    ((Position *)
                     times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,_DimensionsCount);
          for (E._4_4_ = 0; iVar8 = Neuron::getEntriesCount(this), E._4_4_ < iVar8;
              E._4_4_ = E._4_4_ + 1) {
            this_03 = Neuron::getEntry(this,(long)E._4_4_);
            Neuron::Entry::doProcess(this_03);
          }
          for (R._4_4_ = 0; iVar8 = Neuron::getReceptorsCount(this), R._4_4_ < iVar8;
              R._4_4_ = R._4_4_ + 1) {
            this_04 = Neuron::getReceptor(this,(long)R._4_4_);
            bVar2 = Neuron::Receptor::isLocked(this_04);
            if (bVar2) {
              pPStack_c0 = Neuron::Receptor::getPosf(this_04);
            }
            else {
              pPStack_c0 = Neuron::Receptor::getPos(this_04);
            }
            std::pair<float,_float>::pair<float,_float,_true>
                      ((pair<float,_float> *)&stack0xffffffffffffff10);
            P = 0.0;
            Position::doZeroPosition(this_01);
            for (E_1._4_4_ = 0; lVar9 = (long)E_1._4_4_, iVar8 = Neuron::getEntriesCount(this),
                lVar9 < iVar8; E_1._4_4_ = E_1._4_4_ + 1) {
              pEStack_100 = Neuron::getEntry(this,(long)E_1._4_4_);
              for (S._4_4_ = 0; uVar10 = (ulong)S._4_4_,
                  iVar8 = Neuron::Entry::getSynapsesCount(pEStack_100), (long)uVar10 < iVar8;
                  S._4_4_ = S._4_4_ + 1) {
                local_110 = Neuron::Entry::getSynapse(pEStack_100,(ulong)S._4_4_);
                FiValues = (pair<float,_float>)Neuron::Synapse::getPos(local_110);
                fVar11 = Position::getDistanceFrom((Position *)FiValues,pPStack_c0);
                fVar12 = Neuron::Synapse::getLambda(local_110);
                Gamma = Neuron::Synapse::getGamma(local_110);
                dGamma = Neuron::Synapse::getdGamma(local_110);
                local_118 = Computer::getFiFunctionValue(fVar12,Gamma,dGamma,fVar11);
                std::pair<float,_float>::operator=
                          ((pair<float,_float> *)&stack0xffffffffffffff10,&local_118);
                plVar1 = times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                S_00 = FiValues;
                if (0.0 < (float)j_1) {
                  fVar12 = Computer::getFiVectorLength((float)j_1);
                  Computer::getNewPosition
                            ((Position *)plVar1,pPStack_c0,(Position *)S_00,fVar12,fVar11);
                  Position::doAdd(this_01,(Position *)
                                          times.super__Vector_base<long,_std::allocator<long>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                P = local_f0 + P;
              }
            }
            Neuron::Receptor::setFi(this_04,P);
            Neuron::Receptor::doUpdatePos(this_04,this_01);
            bVar2 = Neuron::Receptor::doCheckActive(this_04);
            fVar11 = Neuron::Receptor::getdFi(this_04);
            fVar11 = Computer::getReceptorInfluenceValue(bVar2,fVar11,this_01,this_00);
            DimensionsCount = (uint)((float)DimensionsCount + fVar11);
            Neuron::Receptor::doUpdateSensitivityValue(this_04);
          }
          iVar8 = Neuron::getReceptorsCount(this);
          Neuron::doFinalizeInput(this,(float)DimensionsCount / (float)iVar8);
          pvVar6 = std::vector<long,_std::allocator<long>_>::operator[]
                             ((vector<long,_std::allocator<long>_> *)local_68,local_80);
          *pvVar6 = tT + 1;
          if (iVar7 <= tT + 1) {
            size._4_4_ = size._4_4_ + 1;
          }
        }
      }
      n = std::vector<void_*,_std::allocator<void_*>_>::size
                    ((vector<void_*,_std::allocator<void_*>_> *)lk._8_8_);
    }
    if (this_00 != (Position *)0x0) {
      Position::~Position(this_00);
      operator_delete(this_00,0x10);
    }
    plVar1 = times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    if (times.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage != (pointer)0x0) {
      Position::~Position((Position *)
                          times.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      operator_delete(plVar1,0x10);
    }
    if (this_01 != (Position *)0x0) {
      Position::~Position(this_01);
      operator_delete(this_01,0x10);
    }
    std::atomic<bool>::store((atomic<bool> *)(lk._8_8_ + 0x28),true,memory_order_seq_cst);
    Event::doNotifyOne(*(Event **)(lk._8_8_ + 0x20));
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_68);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&zPos);
  } while( true );
}

Assistant:

[[noreturn]] void indk::ComputeBackendMultithread::tWorker(void* object) {
    auto worker = (indk::Worker*)object;

    while (true) {
        std::unique_lock<std::mutex> lk(worker->m);
        worker -> cv.wait(lk);

        auto zPos = new indk::Position(0, 3);
        auto dRPos = new indk::Position(0, 3);
        auto nRPos = new indk::Position(0, 3);

        std::vector<int64_t> times;
        int tdone = 0;
        uint64_t size = worker -> objects.size();
        while (tdone < size) {
            for (uint64_t n = 0; n < size; n++) {
                if (n >= times.size()) times.push_back(0);
                auto N = (indk::Neuron*)worker -> objects[n];
                auto t = times[n];
                auto ComputeSize = N -> getSignalBufferSize();

                if (t >= ComputeSize) continue;

                if (N->getState(t) != indk::Neuron::States::Pending) {
                    continue;
                }

                float FiSum, D, P = 0;
                auto Xm = N -> getXm();
                auto DimensionsCount = N -> getDimensionsCount();

                zPos -> setXm(Xm);
                zPos -> setDimensionsCount(DimensionsCount);
                dRPos -> setXm(Xm);
                dRPos -> setDimensionsCount(DimensionsCount);
                nRPos -> setXm(Xm);
                nRPos -> setDimensionsCount(DimensionsCount);

                indk::Position *RPos;

                for (int j = 0; j < N->getEntriesCount(); j++) {
                    auto E = N -> getEntry(j);
                    E -> doProcess();
                }

                for (int i = 0; i < N->getReceptorsCount(); i++) {
                    auto R = N->getReceptor(i);
                    if (!R->isLocked()) RPos = R -> getPos();
                    else RPos = R -> getPosf();
                    indk::Position *SPos;
                    std::pair<float, float> FiValues;
                    FiSum = 0;
                    dRPos -> doZeroPosition();

                    for (int j = 0; j < N->getEntriesCount(); j++) {
                        auto E = N -> getEntry(j);

                        for (unsigned int k = 0; k < E->getSynapsesCount(); k++) {
                            auto *S = E -> getSynapse(k);
                            SPos = S -> getPos();
                            D = SPos -> getDistanceFrom(RPos);
                            FiValues = indk::Computer::getFiFunctionValue(S->getLambda(), S->getGamma(), S->getdGamma(), D);
                            if (FiValues.second > 0) {
                                indk::Computer::getNewPosition(nRPos, RPos, SPos, indk::Computer::getFiVectorLength(FiValues.second), D);
                                dRPos -> doAdd(nRPos);
                            }
                            FiSum += FiValues.first;
                        }
                    }

                    R -> setFi(FiSum);
                    R -> doUpdatePos(dRPos);
                    P += indk::Computer::getReceptorInfluenceValue(R->doCheckActive(), R->getdFi(), dRPos, zPos);
                    R -> doUpdateSensitivityValue();
                }
                P /= (float)N->getReceptorsCount();

                N -> doFinalizeInput(P);
                t++;
                times[n] = t;
                if (t >= ComputeSize) {
                    tdone++;
                }
            }
            size = worker -> objects.size();
        }

        delete zPos;
        delete nRPos;
        delete dRPos;

        worker -> done.store(true);
        ((indk::Event*)worker->event) -> doNotifyOne();
    }
}